

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::peer_connection::ignore_unchoke_slots(peer_connection *this)

{
  session_interface *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  int iVar3;
  _Atomic_word _Var4;
  undefined1 uVar5;
  bool bVar6;
  
  uVar5 = 1;
  if (((this->super_peer_connection_hot_members).field_0x2c != '\0') &&
     (psVar1 = (this->super_peer_connection_hot_members).m_ses,
     iVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                       (psVar1,&(this->super_peer_connection_hot_members).field_0x2c),
     (char)iVar3 == '\0')) {
    this_00 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0023d335:
      uVar5 = 0;
    }
    else {
      _Var4 = this_00->_M_use_count;
      do {
        if (_Var4 == 0) goto LAB_0023d335;
        LOCK();
        iVar3 = this_00->_M_use_count;
        bVar6 = _Var4 == iVar3;
        if (bVar6) {
          this_00->_M_use_count = _Var4 + 1;
          iVar3 = _Var4;
        }
        _Var4 = iVar3;
        UNLOCK();
      } while (!bVar6);
      peVar2 = (this->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0 || this_00->_M_use_count == 0) {
        uVar5 = 0;
      }
      else {
        psVar1 = (this->super_peer_connection_hot_members).m_ses;
        iVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                          (psVar1,&peVar2->super_peer_class_set);
        uVar5 = (undefined1)iVar3;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return (bool)uVar5;
}

Assistant:

bool peer_connection::ignore_unchoke_slots() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (num_classes() == 0) return true;

		if (m_ses.ignore_unchoke_slots_set(*this)) return true;
		auto t = m_torrent.lock();
		if (t && m_ses.ignore_unchoke_slots_set(*t)) return true;
		return false;
	}